

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getNameAndString(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  char *__s;
  string *psVar2;
  invalid_argument *this;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  SetAttr local_58;
  
  iVar1 = *i;
  if (iVar1 <= argc + -3) {
    __s = argv[(long)iVar1 + 2];
    std::__cxx11::string::string<std::allocator<char>>(local_78,argv[(long)iVar1 + 1],&local_99);
    psVar2 = (string *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>(local_98,__s,&local_9a);
    Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute(psVar2);
    std::__cxx11::string::string((string *)&local_58,local_78);
    local_58.part = part;
    local_58.attr = (Attribute *)psVar2;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a name and string");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getNameAndString (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3) throw invalid_argument ("Expected a name and string");

    const char* attrName = argv[i + 1];
    const char* str      = argv[i + 2];
    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 3;
}